

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  RtMidi *rtmidi;
  RtMidiIn *rtmidi_00;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc != 2) {
LAB_0010271c:
    usage();
LAB_00102721:
    uVar3 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                      );
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(uVar3);
  }
  iVar2 = atoi(argv[1]);
  rtmidi = (RtMidi *)operator_new(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"RtMidi Output Client","");
  RtMidiOut::RtMidiOut((RtMidiOut *)rtmidi,0,local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  rtmidi_00 = (RtMidiIn *)operator_new(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"RtMidi Input Client","");
  RtMidiIn::RtMidiIn(rtmidi_00,0,local_50,100);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (**(code **)(**(long **)(rtmidi_00 + 8) + 0x58))(*(long **)(rtmidi_00 + 8),0,1,1);
  bVar1 = chooseMidiPort((RtMidi *)rtmidi_00);
  if ((bVar1) && (bVar1 = chooseMidiPort(rtmidi), bVar1)) {
    MidiInApi::setCallback(*(_func_void_double_vector_ptr_void_ptr **)(rtmidi_00 + 8),mycallback);
    local_50[0] = (long *)CONCAT71(local_50[0]._1_7_,0xf6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_68,(uchar *)local_50);
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00102721;
    (**(code **)(**(long **)(rtmidi + 8) + 0x58))();
    usleep(500000);
    bVar1 = true;
    do {
      bVar4 = bVar1;
      if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_50[0] = (long *)CONCAT71(local_50[0]._1_7_,0xf0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_68,(uchar *)local_50);
      if (iVar2 != 0) {
        iVar5 = 0;
        do {
          local_50[0] = (long *)(CONCAT71(local_50[0]._1_7_,(char)iVar5) & 0xffffffffffffff7f);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&local_68,(uchar *)local_50);
          iVar5 = iVar5 + 1;
        } while (iVar2 != iVar5);
      }
      local_50[0] = (long *)CONCAT71(local_50[0]._1_7_,0xf7);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_68,(uchar *)local_50);
      if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
        goto LAB_0010271c;
      }
      (**(code **)(**(long **)(rtmidi + 8) + 0x58))();
      usleep(500000);
      bVar1 = false;
    } while (bVar4);
  }
  (**(code **)(*(long *)rtmidi + 0x40))(rtmidi);
  if (rtmidi_00 != (RtMidiIn *)0x0) {
    (**(code **)(*(long *)rtmidi_00 + 0x40))(rtmidi_00);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
  RtMidiOut *midiout = 0;
  RtMidiIn *midiin = 0;
  std::vector<unsigned char> message;
  unsigned int i, nBytes;

  // Minimal command-line check.
  if ( argc != 2 ) usage();
  nBytes = (unsigned int) atoi( argv[1] );

  // RtMidiOut and RtMidiIn constructors
  try {
    midiout = new RtMidiOut();
    midiin = new RtMidiIn();
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    goto cleanup;
  }

  // Don't ignore sysex, timing, or active sensing messages.
  midiin->ignoreTypes( false, true, true );

  try {
    if ( chooseMidiPort( midiin ) == false ) goto cleanup;
    if ( chooseMidiPort( midiout ) == false ) goto cleanup;
  }
  catch ( RtMidiError &error ) {
    error.printMessage();
    goto cleanup;
  }

  midiin->setCallback( &mycallback );

  message.push_back( 0xF6 );
  midiout->sendMessage( &message );
  SLEEP( 500 ); // pause a little

  // Create a long sysex message of numbered bytes and send it out ... twice.
  for ( int n=0; n<2; n++ ) {
    message.clear();
    message.push_back( 240 );
    for ( i=0; i<nBytes; i++ )
      message.push_back( i % 128 );
    message.push_back( 247 );
    midiout->sendMessage( &message );

    SLEEP( 500 ); // pause a little
  }

  // Clean up
 cleanup:
  delete midiout;
  delete midiin;

  return 0;
}